

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.h
# Opt level: O2

bool __thiscall
cppcms::cache_interface::fetch_data<mydata>
          (cache_interface *this,string *key,mydata *data,bool notriggers)

{
  char cVar1;
  string buffer;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  cVar1 = cppcms::cache_interface::fetch((string *)this,(string *)key,SUB81(&local_30,0));
  if (cVar1 != '\0') {
    serialization_traits<mydata,_void>::load(&local_30,(serializable_base *)data);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return (bool)cVar1;
}

Assistant:

bool fetch_data(std::string const &key,Serializable &data,bool notriggers=false)
		{
			std::string buffer;
			if(!fetch(key,buffer,notriggers))
				return false;
			serialization_traits<Serializable>::load(buffer,data);
			return true;
		}